

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

int __thiscall
kratos::AssignStmt::clone
          (AssignStmt *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_type *psVar1;
  pointer this_00;
  shared_ptr<kratos::Var> local_58;
  shared_ptr<kratos::Var> local_48;
  _func_int **local_38;
  pointer local_30;
  undefined1 local_21;
  
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)(__fn + 0xc0) + 0x68))
  ;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)(__fn + 200) + 0x68));
  std::__shared_ptr<kratos::AssignStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::AssignStmt>,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>,kratos::AssignmentType_const&>
            ((__shared_ptr<kratos::AssignStmt,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<kratos::AssignStmt> *)&local_21,&local_58,&local_48,
             (AssignmentType *)(__fn + 0xd0));
  if (local_48.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this_00 = local_30;
  if (local_30 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(local_30->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(local_30->first)._M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  *(undefined4 *)(local_38 + 4) = *(undefined4 *)(__fn + 0x20);
  std::__cxx11::string::_M_assign((string *)(local_38 + 5));
  if (this_00 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  (this->super_Stmt).super_IRNode._vptr_IRNode = local_38;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_30;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> AssignStmt::clone() const {
    auto stmt = std::make_shared<AssignStmt>(left_->shared_from_this(), right_->shared_from_this(),
                                             assign_type_);
    copy_meta(stmt);
    return stmt;
}